

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O1

value_type __thiscall
jsoncons::jsonpath::detail::
min_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(min_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar6;
  size_t sVar7;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *rhs;
  error_code *in_RCX;
  ulong uVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  ulong i;
  size_t i_00;
  value_type vVar10;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_40;
  
  pcVar1 = *(char **)ec;
  if (((long)ec->_M_cat - (long)pcVar1 >> 3) * -0x5555555555555555 -
      (long)(args->
            super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish != 0) {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar6);
    uVar9 = extraout_RDX;
    goto LAB_00443d76;
  }
  if (*pcVar1 == '\0') {
    pbVar6 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
              (pcVar1 + 8);
  }
  else {
    pbVar6 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (pcVar1 + 8);
  }
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
            (&local_40,pbVar6);
  bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                    (&local_40);
  if (bVar2) {
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::empty
                      (&local_40);
    if (bVar2) goto LAB_00443d5c;
    pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                       (&local_40,0);
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_number
                      (pbVar6);
    pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                       (&local_40,0);
    bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_string
                      (pbVar6);
    if (bVar2 || bVar3) {
      i = 1;
      i_00 = 0;
      while( true ) {
        sVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                          (&local_40);
        if (sVar7 <= i) break;
        pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (&local_40,i);
        bVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_number(pbVar6);
        if (bVar2 != bVar4) {
LAB_00443da7:
          std::error_code::operator=(in_RCX,invalid_type);
          pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null
                             ();
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
          uninitialized_copy((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)this,pbVar6);
          goto LAB_00443d6c;
        }
        pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (&local_40,i);
        bVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_string(pbVar6);
        if (bVar3 != bVar4) goto LAB_00443da7;
        pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           (&local_40,i);
        rhs = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                        (&local_40,i_00);
        iVar5 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::compare
                          (pbVar6,rhs);
        uVar8 = i;
        if (-1 < iVar5) {
          uVar8 = i_00;
        }
        i = i + 1;
        i_00 = uVar8;
      }
      pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                         (&local_40,i_00);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
                 pbVar6);
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
                 pbVar6);
    }
  }
  else {
    std::error_code::operator=(in_RCX,invalid_type);
LAB_00443d5c:
    pbVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar6);
  }
LAB_00443d6c:
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy(&local_40);
  uVar9 = extraout_RDX_00;
LAB_00443d76:
  vVar10.field_0.int64_.val_ = uVar9;
  vVar10.field_0._0_8_ = this;
  return (value_type)vVar10.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                //std::cout << "arg: " << arg0 << "\n";
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            if (arg0.empty())
            {
                return value_type::null();
            }
            bool is_number = arg0.at(0).is_number();
            bool is_string = arg0.at(0).is_string();
            if (!is_number && !is_string)
            {
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }

            std::size_t index = 0;
            for (std::size_t i = 1; i < arg0.size(); ++i)
            {
                if (!(arg0.at(i).is_number() == is_number && arg0.at(i).is_string() == is_string))
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                if (arg0.at(i) < arg0.at(index))
                {
                    index = i;
                }
            }

            return arg0.at(index);
        }